

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
anurbs::NurbsCurveGeometry<2L>::nonzero_pole_indices_at_span
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,NurbsCurveGeometry<2L> *this,
          Index span)

{
  pointer plVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  allocator_type local_19;
  long lVar9;
  
  iVar3 = (*(this->super_CurveBase<2L>)._vptr_CurveBase[2])(this);
  std::vector<long,_std::allocator<long>_>::vector
            (__return_storage_ptr__,CONCAT44(extraout_var,iVar3) + 1,&local_19);
  iVar3 = (*(this->super_CurveBase<2L>)._vptr_CurveBase[2])(this);
  auVar2 = _DAT_002d0130;
  plVar1 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)plVar1 >> 3;
  if (0 < lVar4) {
    lVar5 = lVar4 + -1;
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar6 = 1;
    auVar7 = auVar7 ^ _DAT_002d0130;
    auVar8 = _DAT_002d0120;
    lVar5 = span - CONCAT44(extraout_var_00,iVar3);
    do {
      auVar10 = auVar8 ^ auVar2;
      if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                  auVar7._4_4_ < auVar10._4_4_) & 1)) {
        plVar1[lVar6 + -1] = lVar5 + 1;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        plVar1[lVar6] = lVar5 + 2;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar9 = lVar6 - (lVar4 + 1U & 0x7ffffffffffffffe);
      lVar6 = lVar6 + 2;
      lVar5 = lVar5 + 2;
    } while (lVar9 != -1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> nonzero_pole_indices_at_span(const Index span) const
    {
        std::vector<Index> result(degree() + 1);

        const Index first_nonzero_pole_index = span - degree() + 1;

        for (Index i = 0; i < length(result); i++) {
            result[i] = first_nonzero_pole_index + i;
        }

        return result;
    }